

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall
TPZTensor<double>::EigenProjection
          (TPZTensor<double> *this,TPZVec<double> *EigenVals,int index,
          TPZVec<int> *DistinctEigenvalues,TPZTensor<double> *Ei)

{
  double dVar1;
  int iVar2;
  int64_t iVar3;
  int *piVar4;
  double *pdVar5;
  TPZVec<int> *in_RCX;
  int in_EDX;
  TPZVec<double> *in_RSI;
  int j;
  int count;
  TPZFNMatrix<9,_double> resultingTensor;
  TPZFNMatrix<9,_double> aux;
  TPZFNMatrix<9,_double> local;
  int p;
  int in_stack_fffffffffffffc4c;
  TPZTensor<double> *in_stack_fffffffffffffc50;
  double *in_stack_fffffffffffffc60;
  _func_int **in_stack_fffffffffffffc68;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffffc70;
  TPZFMatrix<double> *in_stack_fffffffffffffc78;
  TPZTensor<double> *in_stack_fffffffffffffc80;
  TPZMatrix<double> *in_stack_fffffffffffffc98;
  int opt;
  TPZFMatrix<double> *in_stack_fffffffffffffca0;
  TPZFMatrix<double> *in_stack_fffffffffffffca8;
  TPZMatrix<double> *in_stack_fffffffffffffcb0;
  int local_2e4;
  
  iVar3 = TPZVec<int>::NElements(in_RCX);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffc70,(int64_t)in_stack_fffffffffffffc68,
             (int64_t)in_stack_fffffffffffffc60);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffc70,(int64_t)in_stack_fffffffffffffc68,
             (int64_t)in_stack_fffffffffffffc60);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffc70,(int64_t)in_stack_fffffffffffffc68,
             (int64_t)in_stack_fffffffffffffc60);
  Identity(in_stack_fffffffffffffc50);
  for (local_2e4 = 0; local_2e4 < (int)iVar3; local_2e4 = local_2e4 + 1) {
    piVar4 = TPZVec<int>::operator[](in_RCX,(long)local_2e4);
    iVar2 = *piVar4;
    if (iVar2 != in_EDX) {
      TPZMatrix<double>::Identity((TPZMatrix<double> *)in_stack_fffffffffffffc80);
      TPZVec<double>::operator[](in_RSI,(long)iVar2);
      TPZFMatrix<double>::operator*=
                (&in_stack_fffffffffffffc70->super_TPZFMatrix<double>,
                 (double)in_stack_fffffffffffffc68);
      CopyToTensor(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      TPZFMatrix<double>::operator+=(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
      opt = (int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
      TPZVec<double>::operator[](in_RSI,(long)in_EDX);
      TPZVec<double>::operator[](in_RSI,(long)iVar2);
      TPZFMatrix<double>::operator*=
                (&in_stack_fffffffffffffc70->super_TPZFMatrix<double>,
                 (double)in_stack_fffffffffffffc68);
      CopyToTensor(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      TPZMatrix<double>::Multiply
                (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,opt);
      pdVar5 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffc70->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffc68,(int64_t)in_stack_fffffffffffffc60);
      dVar1 = *pdVar5;
      pdVar5 = operator[](in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
      *pdVar5 = dVar1;
      pdVar5 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffc70->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffc68,(int64_t)in_stack_fffffffffffffc60);
      in_stack_fffffffffffffcb0 = (TPZMatrix<double> *)*pdVar5;
      pdVar5 = operator[](in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
      *pdVar5 = (double)in_stack_fffffffffffffcb0;
      in_stack_fffffffffffffca8 =
           (TPZFMatrix<double> *)
           TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffc70->super_TPZFMatrix<double>,
                      (int64_t)in_stack_fffffffffffffc68,(int64_t)in_stack_fffffffffffffc60);
      in_stack_fffffffffffffc98 =
           (TPZMatrix<double> *)
           (in_stack_fffffffffffffca8->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable
           ._vptr_TPZSavable;
      in_stack_fffffffffffffca0 =
           (TPZFMatrix<double> *)operator[](in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
      (in_stack_fffffffffffffca0->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = (_func_int **)in_stack_fffffffffffffc98;
      pdVar5 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffc70->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffc68,(int64_t)in_stack_fffffffffffffc60);
      in_stack_fffffffffffffc80 = (TPZTensor<double> *)*pdVar5;
      pdVar5 = operator[](in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
      *pdVar5 = (double)in_stack_fffffffffffffc80;
      in_stack_fffffffffffffc78 =
           (TPZFMatrix<double> *)
           TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffc70->super_TPZFMatrix<double>,
                      (int64_t)in_stack_fffffffffffffc68,(int64_t)in_stack_fffffffffffffc60);
      in_stack_fffffffffffffc68 =
           (in_stack_fffffffffffffc78->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable
           ._vptr_TPZSavable;
      in_stack_fffffffffffffc70 =
           (TPZFNMatrix<9,_double> *)operator[](in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c)
      ;
      (in_stack_fffffffffffffc70->super_TPZFMatrix<double>).super_TPZMatrix<double>.
      super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = in_stack_fffffffffffffc68;
      in_stack_fffffffffffffc60 =
           TPZFMatrix<double>::operator()
                     ((TPZFMatrix<double> *)in_stack_fffffffffffffc70,
                      (int64_t)in_stack_fffffffffffffc68,(int64_t)in_stack_fffffffffffffc60);
      in_stack_fffffffffffffc50 = (TPZTensor<double> *)*in_stack_fffffffffffffc60;
      pdVar5 = operator[](in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
      *pdVar5 = (double)in_stack_fffffffffffffc50;
    }
  }
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x14ae323);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x14ae330);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x14ae33d);
  return;
}

Assistant:

void TPZTensor<T>::EigenProjection(const TPZVec<T> &EigenVals, int index, const TPZVec<int> &DistinctEigenvalues, TPZTensor<T> &Ei) const {
    const int p = DistinctEigenvalues.NElements();
    TPZFNMatrix<9, T> local(3, 3), aux(3, 3), resultingTensor(3, 3);
    Ei.Identity();
    for (int count = 0; count < p; ++count) {
        const int j = DistinctEigenvalues[count];
        if (j == index) continue;
        local.Identity();
        local *= -1. * EigenVals[j];

        this->CopyToTensor(aux);
        local += aux;

#ifdef PZDEBUG
        if (AreEqual(EigenVals[index], EigenVals[j])) DebugStop();
#endif
        local *= 1. / (EigenVals[index] - EigenVals[j]);
        Ei.CopyToTensor(aux);
        aux.Multiply(local, resultingTensor);
        Ei[_XX_] = resultingTensor(0, 0);
        Ei[_XY_] = resultingTensor(0, 1);
        Ei[_XZ_] = resultingTensor(0, 2);
        Ei[_YY_] = resultingTensor(1, 1);
        Ei[_YZ_] = resultingTensor(1, 2);
        Ei[_ZZ_] = resultingTensor(2, 2);
    }//for j
}